

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.hpp
# Opt level: O1

type * __thiscall
boost::algorithm::
join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
          (type *__return_storage_ptr__,algorithm *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *Input,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Separator)

{
  ulong *puVar1;
  long lVar2;
  ulong *puVar3;
  ulong *puVar4;
  
  puVar3 = *(ulong **)(this + 0x10);
  puVar4 = *(ulong **)(this + 0x20);
  lVar2 = *(long *)(this + 0x28);
  puVar1 = *(ulong **)(this + 0x30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (puVar3 == puVar1) goto LAB_0012fb6b;
  std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x0,*puVar3);
  while( true ) {
    puVar3 = puVar3 + 4;
    if (puVar3 == puVar4) {
      puVar3 = *(ulong **)(lVar2 + 8);
      lVar2 = lVar2 + 8;
      puVar4 = puVar3 + 0x40;
    }
LAB_0012fb6b:
    if (puVar3 == puVar1) break;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)(Input->
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Deque_impl_data._M_map);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               *puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline typename range_value<SequenceSequenceT>::type 
        join(
            const SequenceSequenceT& Input,
            const Range1T& Separator)
        {
            // Define working types
            typedef typename range_value<SequenceSequenceT>::type ResultT;
            typedef typename range_const_iterator<SequenceSequenceT>::type InputIteratorT;

            // Parse input
            InputIteratorT itBegin=::boost::begin(Input);
            InputIteratorT itEnd=::boost::end(Input);

            // Construct container to hold the result
            ResultT Result;
            
            // Append first element
            if(itBegin!=itEnd)
            {
                detail::insert(Result, ::boost::end(Result), *itBegin);
                ++itBegin;
            }

            for(;itBegin!=itEnd; ++itBegin)
            {
                // Add separator
                detail::insert(Result, ::boost::end(Result), ::boost::as_literal(Separator));
                // Add element
                detail::insert(Result, ::boost::end(Result), *itBegin);
            }

            return Result;
        }